

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_235b14::NullBackend::mixerProc(NullBackend *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ALCdevice *pAVar6;
  milliseconds restTime;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  pAVar6 = (this->super_BackendBase).mDevice;
  uVar5 = 0;
  local_38.__r = (ulong)(pAVar6->UpdateSize * 1000) / (ulong)pAVar6->Frequency >> 1;
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  lVar1 = std::chrono::_V2::steady_clock::now();
  while ((((this->mKillNow)._M_base._M_i & 1U) == 0 &&
         (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) != 0))) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    pAVar6 = (this->super_BackendBase).mDevice;
    uVar4 = (ulong)pAVar6->UpdateSize;
    lVar2 = (long)((lVar2 - lVar1) * (ulong)pAVar6->Frequency) / 1000000000;
    if ((long)(lVar2 - uVar5) < (long)uVar4) {
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
    }
    else {
      for (; (long)uVar4 <= (long)(lVar2 - uVar5); uVar5 = uVar5 + uVar4) {
        ALCdevice::renderSamples(pAVar6,(void *)0x0,(ALuint)uVar4,0);
        pAVar6 = (this->super_BackendBase).mDevice;
        uVar4 = (ulong)pAVar6->UpdateSize;
      }
      uVar4 = (ulong)pAVar6->Frequency;
      if ((long)uVar4 <= (long)uVar5) {
        uVar3 = uVar5 / uVar4;
        uVar5 = uVar5 % uVar4;
        lVar1 = lVar1 + uVar3 * 1000000000;
      }
    }
  }
  return 0;
}

Assistant:

int NullBackend::mixerProc()
{
    const milliseconds restTime{mDevice->UpdateSize*1000/mDevice->Frequency / 2};

    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    int64_t done{0};
    auto start = std::chrono::steady_clock::now();
    while(!mKillNow.load(std::memory_order_acquire)
        && mDevice->Connected.load(std::memory_order_acquire))
    {
        auto now = std::chrono::steady_clock::now();

        /* This converts from nanoseconds to nanosamples, then to samples. */
        int64_t avail{std::chrono::duration_cast<seconds>((now-start) * mDevice->Frequency).count()};
        if(avail-done < mDevice->UpdateSize)
        {
            std::this_thread::sleep_for(restTime);
            continue;
        }
        while(avail-done >= mDevice->UpdateSize)
        {
            mDevice->renderSamples(nullptr, mDevice->UpdateSize, 0u);
            done += mDevice->UpdateSize;
        }

        /* For every completed second, increment the start time and reduce the
         * samples done. This prevents the difference between the start time
         * and current time from growing too large, while maintaining the
         * correct number of samples to render.
         */
        if(done >= mDevice->Frequency)
        {
            seconds s{done/mDevice->Frequency};
            start += s;
            done -= mDevice->Frequency*s.count();
        }
    }

    return 0;
}